

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uprops.cpp
# Opt level: O0

int32_t u_getIntPropertyMaxValue_63(UProperty which)

{
  int32_t iVar1;
  IntProperty *prop;
  UProperty which_local;
  
  if (which < UCHAR_BIDI_CLASS) {
    if ((UCHAR_INVALID_CODE < which) && (which < UCHAR_BINARY_LIMIT)) {
      return 1;
    }
  }
  else if (which < UCHAR_INT_LIMIT) {
    iVar1 = (*intProps[which + 0xfffff000].getMaxValue)(intProps + (which + 0xfffff000),which);
    return iVar1;
  }
  return -1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_getIntPropertyMaxValue(UProperty which) {
    if(which<UCHAR_INT_START) {
        if(UCHAR_BINARY_START<=which && which<UCHAR_BINARY_LIMIT) {
            return 1;  // maximum TRUE for all binary properties
        }
    } else if(which<UCHAR_INT_LIMIT) {
        const IntProperty &prop=intProps[which-UCHAR_INT_START];
        return prop.getMaxValue(prop, which);
    }
    return -1;  // undefined
}